

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.cpp
# Opt level: O1

string * license::remove_extension(string *__return_storage_ptr__,string *path)

{
  pointer pcVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  
  iVar2 = std::__cxx11::string::compare((char *)path);
  if (((iVar2 != 0) && (iVar2 = std::__cxx11::string::compare((char *)path), iVar2 != 0)) &&
     (uVar3 = std::__cxx11::string::find_last_of((char *)path,0x45863b,0xffffffffffffffff),
     uVar3 != 0xffffffffffffffff)) {
    uVar4 = std::__cxx11::string::find_last_of((char *)path,0x43b578,0xffffffffffffffff);
    if (uVar4 == 0xffffffffffffffff) {
      if (uVar3 != 0) goto LAB_0018ce6c;
    }
    else if (uVar4 <= uVar3) {
LAB_0018ce6c:
      std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)path);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (path->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + path->_M_string_length);
  return __return_storage_ptr__;
}

Assistant:

string remove_extension(const string& path) {
	if (path == "." || path == "..") {
		return path;
	}
	size_t dotpos = path.find_last_of(".");
	//no dot
	if (dotpos == string::npos) {
		return path;
	}
	//find the last path separator
	size_t pathsep_pos = path.find_last_of("\\/");
	if (pathsep_pos == string::npos) {
		return (dotpos == 0 ? path : path.substr(0, dotpos));
	} else if(pathsep_pos >= dotpos +1) {
		return path;
	}
	return path.substr(0, dotpos);
}